

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

_Bool ssh_ntru_client_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  BinarySink *pBVar1;
  uint8_t val;
  uint ok_00;
  ecdh_key *peVar2;
  uint16_t *ct;
  uint16_t *plaintext_00;
  strbuf *sb;
  mp_int *x;
  ptrlen pVar3;
  ptrlen confirmation_hash_00;
  ptrlen remoteKey_00;
  uint local_154;
  uint i_1;
  mp_int *curvekey;
  undefined1 local_138 [8];
  BinarySource src_1 [1];
  _Bool ok_1;
  strbuf *otherkey;
  size_t i;
  uint mask;
  uint ok;
  uint16_t *plaintext;
  uint8_t hashdata [64];
  ssh_hash *h;
  ptrlen curve25519_remoteKey;
  ptrlen confirmation_hash;
  ptrlen ciphertext_encoded;
  uint16_t *ciphertext;
  BinarySource src [1];
  ntru_client_key *nk;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  ptrlen remoteKey_local;
  
  peVar2 = dh + -2;
  BinarySource_INIT__((BinarySource *)&ciphertext,remoteKey);
  ct = (uint16_t *)safemalloc(0x2f9,2,0);
  pVar3 = ntru_decode_ciphertext(ct,(NTRUKeyPair *)peVar2->vt,(BinarySource *)&ciphertext);
  confirmation_hash_00 = BinarySource_get_data((BinarySource *)src[0]._24_8_,0x20);
  remoteKey_00 = BinarySource_get_data((BinarySource *)src[0]._24_8_,0x20);
  if ((*(int *)(src[0]._24_8_ + 0x18) == 0) &&
     (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8))) {
    hashdata._56_8_ = ssh_hash_new(&ssh_sha512);
    plaintext_00 = (uint16_t *)safemalloc(0x2f9,2,0);
    ntru_decrypt(plaintext_00,ct,(NTRUKeyPair *)peVar2->vt);
    ntru_confirmation_hash
              ((uint8_t *)&plaintext,plaintext_00,(uint16_t *)peVar2->vt->getpublic,0x2f9,0x11ef);
    curve25519_remoteKey.len = (size_t)confirmation_hash_00.ptr;
    ok_00 = smemeq(&plaintext,(void *)curve25519_remoteKey.len,0x20);
    for (otherkey = (strbuf *)0x0; otherkey < (strbuf *)0x2f9;
        otherkey = (strbuf *)((long)&otherkey->s + 1)) {
      plaintext_00[(long)otherkey] =
           plaintext_00[(long)otherkey] ^
           (short)ok_00 - 1U &
           (plaintext_00[(long)otherkey] ^ *(ushort *)(peVar2->vt[1].new + (long)otherkey * 2));
    }
    ntru_session_hash((uint8_t *)&plaintext,ok_00,plaintext_00,0x2f9,pVar3,confirmation_hash_00);
    ring_free(plaintext_00,0x2f9);
    ring_free(ct,0x2f9);
    BinarySink_put_data(*(BinarySink **)(hashdata._56_8_ + 8),&plaintext,0x20);
    sb = strbuf_new_nm();
    src_1[0].binarysource_._7_1_ =
         ecdh_key_getkey((ecdh_key *)dh[-1].vt,remoteKey_00,sb->binarysink_);
    if ((bool)src_1[0].binarysource_._7_1_) {
      pVar3 = ptrlen_from_strbuf(sb);
      BinarySource_INIT__((BinarySource *)local_138,pVar3);
      x = BinarySource_get_mp_ssh2((BinarySource *)src_1[0]._24_8_);
      local_154 = 0x20;
      while (local_154 != 0) {
        pBVar1 = *(BinarySink **)(hashdata._56_8_ + 8);
        val = mp_get_byte(x,(ulong)(local_154 - 1));
        BinarySink_put_byte(pBVar1,val);
        local_154 = local_154 - 1;
      }
      mp_free(x);
      strbuf_free(sb);
      ssh_hash_final((ssh_hash *)hashdata._56_8_,(uchar *)&plaintext);
      pBVar1 = bs->binarysink_;
      pVar3 = make_ptrlen(&plaintext,0x40);
      BinarySink_put_stringpl(pBVar1,pVar3);
      smemclr(&plaintext,0x40);
      remoteKey_local.len._7_1_ = true;
    }
    else {
      ssh_hash_free((ssh_hash *)hashdata._56_8_);
      smemclr(&plaintext,0x40);
      remoteKey_local.len._7_1_ = false;
    }
  }
  else {
    ring_free(ct,0x2f9);
    remoteKey_local.len._7_1_ = false;
  }
  return remoteKey_local.len._7_1_;
}

Assistant:

static bool ssh_ntru_client_getkey(ecdh_key *dh, ptrlen remoteKey,
                                   BinarySink *bs)
{
    ntru_client_key *nk = container_of(dh, ntru_client_key, ek);

    /*
     * We expect the server to have sent us a string containing a
     * ciphertext, a confirmation hash, and a Curve25519 public point.
     * Extract all three.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, remoteKey);

    uint16_t *ciphertext = snewn(p_LIVE, uint16_t);
    ptrlen ciphertext_encoded = ntru_decode_ciphertext(
        ciphertext, nk->keypair, src);
    ptrlen confirmation_hash = get_data(src, 32);
    ptrlen curve25519_remoteKey = get_data(src, 32);

    if (get_err(src) || get_avail(src)) {
        /* Hard-fail if the input wasn't exactly the right length */
        ring_free(ciphertext, p_LIVE);
        return false;
    }

    /*
     * Main hash object which will combine the NTRU and Curve25519
     * outputs.
     */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);

    /* Reusable buffer for storing various hash outputs. */
    uint8_t hashdata[64];

    /*
     * NTRU side.
     */
    {
        /* Decrypt the ciphertext to recover the server's plaintext */
        uint16_t *plaintext = snewn(p_LIVE, uint16_t);
        ntru_decrypt(plaintext, ciphertext, nk->keypair);

        /* Make the confirmation hash */
        ntru_confirmation_hash(hashdata, plaintext, nk->keypair->h,
                               p_LIVE, q_LIVE);

        /* Check it matches the one the server sent */
        unsigned ok = smemeq(hashdata, confirmation_hash.ptr, 32);

        /* If not, substitute in rho for the plaintext in the session hash */
        unsigned mask = ok-1;
        for (size_t i = 0; i < p_LIVE; i++)
            plaintext[i] ^= mask & (plaintext[i] ^ nk->keypair->rho[i]);

        /* Compute the session hash, whether or not we did that */
        ntru_session_hash(hashdata, ok, plaintext, p_LIVE, ciphertext_encoded,
                          confirmation_hash);

        /* Free temporary values */
        ring_free(plaintext, p_LIVE);
        ring_free(ciphertext, p_LIVE);

        /* And put the NTRU session hash into the main hash object. */
        put_data(h, hashdata, 32);
    }

    /*
     * Curve25519 side.
     */
    {
        strbuf *otherkey = strbuf_new_nm();

        /* Call out to Curve25519 to compute the shared secret from that
         * kex method */
        bool ok = ecdh_key_getkey(nk->curve25519, curve25519_remoteKey,
                                  BinarySink_UPCAST(otherkey));

        /* If that failed (which only happens if the other end does
         * something wrong, like sending a low-order curve point
         * outside the subgroup it's supposed to), we might as well
         * just abort and return failure. That's what we'd have done
         * in standalone Curve25519. */
        if (!ok) {
            ssh_hash_free(h);
            smemclr(hashdata, sizeof(hashdata));
            return false;
        }

        /*
         * ecdh_key_getkey will have returned us a chunk of data
         * containing an encoded mpint, which is how the Curve25519
         * output normally goes into the exchange hash. But in this
         * context we want to treat it as a fixed big-endian 32 bytes,
         * so extract it from its encoding and put it into the main
         * hash object in the new format.
         */
        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(otherkey));
        mp_int *curvekey = get_mp_ssh2(src);

        for (unsigned i = 32; i-- > 0 ;)
            put_byte(h, mp_get_byte(curvekey, i));

        mp_free(curvekey);
        strbuf_free(otherkey);
    }

    /*
     * Finish up: compute the final output hash (full 64 bytes of
     * SHA-512 this time), and return it encoded as a string.
     */
    ssh_hash_final(h, hashdata);
    put_stringpl(bs, make_ptrlen(hashdata, sizeof(hashdata)));
    smemclr(hashdata, sizeof(hashdata));

    return true;
}